

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linker.cpp
# Opt level: O3

glsl_type *
array_sizing_visitor::resize_interface_members
          (glsl_type *type,int *max_ifc_array_access,bool is_ssbo)

{
  uint num_fields;
  byte bVar1;
  glsl_type *pgVar2;
  glsl_struct_field *pgVar3;
  ulong uVar4;
  ulong uVar5;
  bool implicit_sized_array;
  bool local_41;
  glsl_struct_field *local_40;
  glsl_type *local_38;
  
  num_fields = type->length;
  uVar4 = (ulong)num_fields;
  uVar5 = uVar4 * 0x30;
  local_40 = (glsl_struct_field *)operator_new__(uVar5);
  local_38 = type;
  if (uVar4 == 0) {
    memcpy(local_40,(type->fields).array,uVar5);
  }
  else {
    pgVar3 = local_40;
    do {
      pgVar3->type = (glsl_type *)0x0;
      pgVar3->name = (char *)0x0;
      pgVar3->location = -1;
      pgVar3->offset = -1;
      pgVar3->xfb_buffer = 0;
      pgVar3->xfb_stride = 0;
      *(ushort *)&pgVar3->field_0x20 = *(ushort *)&pgVar3->field_0x20 & 0x8000;
      pgVar3->image_format = PIPE_FORMAT_NONE;
      pgVar3->field_0x28 = pgVar3->field_0x28 & 0xfc;
      pgVar3 = pgVar3 + 1;
    } while (pgVar3 != local_40 + uVar4);
    memcpy(local_40,(type->fields).array,uVar5);
    if (uVar4 != 0) {
      uVar5 = 0;
      pgVar3 = local_40;
      do {
        bVar1 = pgVar3->field_0x28;
        local_41 = (bool)(bVar1 >> 1 & 1);
        if (num_fields - 1 != uVar5 || !is_ssbo) {
          fixup_type(&pgVar3->type,max_ifc_array_access[uVar5],false,&local_41);
          bVar1 = pgVar3->field_0x28;
        }
        pgVar3->field_0x28 = bVar1 & 0xfd | local_41 * '\x02';
        uVar5 = uVar5 + 1;
        pgVar3 = pgVar3 + 1;
      } while (uVar4 != uVar5);
    }
  }
  pgVar3 = local_40;
  pgVar2 = glsl_type::get_interface_instance
                     (local_40,num_fields,
                      *(uint *)&local_38->field_0x4 >> 0x16 & GLSL_INTERFACE_PACKING_STD430,
                      (bool)((byte)(*(uint *)&local_38->field_0x4 >> 0x18) & 1),local_38->name);
  operator_delete__(pgVar3);
  return pgVar2;
}

Assistant:

static const glsl_type *
   resize_interface_members(const glsl_type *type,
                            const int *max_ifc_array_access,
                            bool is_ssbo)
   {
      unsigned num_fields = type->length;
      glsl_struct_field *fields = new glsl_struct_field[num_fields];
      memcpy(fields, type->fields.structure,
             num_fields * sizeof(*fields));
      for (unsigned i = 0; i < num_fields; i++) {
         bool implicit_sized_array = fields[i].implicit_sized_array;
         /* If SSBO last member is unsized array, we don't replace it by a sized
          * array.
          */
         if (is_ssbo && i == (num_fields - 1))
            fixup_type(&fields[i].type, max_ifc_array_access[i],
                       true, &implicit_sized_array);
         else
            fixup_type(&fields[i].type, max_ifc_array_access[i],
                       false, &implicit_sized_array);
         fields[i].implicit_sized_array = implicit_sized_array;
      }
      glsl_interface_packing packing =
         (glsl_interface_packing) type->interface_packing;
      bool row_major = (bool) type->interface_row_major;
      const glsl_type *new_ifc_type =
         glsl_type::get_interface_instance(fields, num_fields,
                                           packing, row_major, type->name);
      delete [] fields;
      return new_ifc_type;
   }